

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,3,4,0,3,4>,Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,3,4,false>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_3,_4,_0,_3,_4> *dst,
               Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false> *src,
               assign_op<float,_float> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  DstEvaluatorType local_38;
  SrcEvaluatorType local_30;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_20;
  
  local_20.m_dst = &local_38;
  local_30.super_block_evaluator<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_Eigen::Matrix<float,_3,_4,_0,_3,_4>_>
  .m_data = (src->
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false,_Eigen::Dense>).
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>,_0>.
            m_data;
  local_20.m_src = &local_30;
  local_38.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>_>)dst;
  local_20.m_functor = func;
  local_20.m_dstExpr = dst;
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_4,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_12>
  ::run(&local_20);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}